

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointer(Instruction *this)

{
  bool bVar1;
  FeatureManager *pFVar2;
  
  pFVar2 = IRContext::get_feature_mgr(this->context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar2->capabilities_,Shader);
  if (bVar1) {
    bVar1 = IsReadOnlyPointerShaders(this);
    return bVar1;
  }
  bVar1 = IsReadOnlyPointerKernel(this);
  return bVar1;
}

Assistant:

bool Instruction::IsReadOnlyPointer() const {
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return IsReadOnlyPointerShaders();
  else
    return IsReadOnlyPointerKernel();
}